

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testchar.c
# Opt level: O0

int testUTF16(void)

{
  int iVar1;
  xmlCharEncodingHandlerPtr handler;
  xmlCharEncodingHandlerPtr handler_00;
  int local_1c;
  int ret;
  xmlCharEncodingHandlerPtr handler16BE;
  xmlCharEncodingHandlerPtr handler16LE;
  
  local_1c = 0;
  handler = (xmlCharEncodingHandlerPtr)xmlFindCharEncodingHandler("UTF-16LE");
  handler_00 = (xmlCharEncodingHandlerPtr)xmlFindCharEncodingHandler("UTF-16BE");
  iVar1 = testEncHandler(handler,testUTF16::utf8,0x14,"\x01",0x14);
  if (iVar1 != 0) {
    local_1c = -1;
  }
  iVar1 = testEncHandler(handler_00,testUTF16::utf8,0x14,"",0x14);
  if (iVar1 != 0) {
    local_1c = -1;
  }
  return local_1c;
}

Assistant:

static int
testUTF16(void) {
    static const xmlChar utf8[] =
        "\x01"
        "\x7F"
        "\xC2\x80"
        "\xDF\xBF"
        "\xE0\xA0\x80"
        "\xEF\xBF\xBF"
        "\xF0\x90\x80\x80"
        "\xF4\x8F\xBF\xBF";
    static const xmlChar utf16LE[] =
        "\x01\x00"
        "\x7F\x00"
        "\x80\x00"
        "\xFF\x07"
        "\x00\x08"
        "\xFF\xFF"
        "\x00\xD8\x00\xDC"
        "\xFF\xDB\xFF\xDF";
    static const xmlChar utf16BE[] =
        "\x00\x01"
        "\x00\x7F"
        "\x00\x80"
        "\x07\xFF"
        "\x08\x00"
        "\xFF\xFF"
        "\xD8\x00\xDC\x00"
        "\xDB\xFF\xDF\xFF";

    xmlCharEncodingHandlerPtr handler16LE, handler16BE;
    int ret = 0;

    handler16LE = xmlFindCharEncodingHandler("UTF-16LE");
    handler16BE = xmlFindCharEncodingHandler("UTF-16BE");

    if (testEncHandler(handler16LE,
                       utf8, sizeof(utf8) - 1,
                       utf16LE, sizeof(utf16LE) - 1) != 0)
        ret = -1;
    if (testEncHandler(handler16BE,
                       utf8, sizeof(utf8) - 1,
                       utf16BE, sizeof(utf16BE) - 1) != 0)
        ret = -1;

    return(ret);
}